

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

void CMinitialize(CManager_conflict cm)

{
  int iVar1;
  char *pcVar2;
  pending_queue ppVar3;
  pending_queue ppVar4;
  CManager_conflict cl;
  
  pcVar2 = getenv("CMDefaultTransport");
  if (pcVar2 != (char *)0x0) {
    CMglobal_default_transport = pcVar2;
  }
  if (CMglobal_default_transport != (char *)0x0) {
    cl = cm;
    iVar1 = load_transport(cm,CMglobal_default_transport,0);
    if (iVar1 == 0) {
      CMinitialize_cold_1();
      ppVar4 = cl->pending_data_queue;
      if (ppVar4 != (pending_queue)0x0) {
        ppVar3 = (pending_queue)pthread_self();
        if (ppVar4 != ppVar3) {
          CMcontrol_list_wait_cold_1();
        }
      }
      ppVar4 = (pending_queue)pthread_self();
      cl->pending_data_queue = ppVar4;
      if (cl->transports != (transport_entry_conflict *)0x0) {
        (*(code *)cl->transports)(&CMstatic_trans_svcs,cl->control_module_choice);
      }
      CMcontrol_list_poll((CMControlList)cl);
      return;
    }
  }
  cm->initialized = cm->initialized + 1;
  return;
}

Assistant:

static void 
CMinitialize(CManager cm)
{
    char **transport_names = CMglobal_alternate_transports;
    char *def = getenv("CMDefaultTransport");
    if (def != NULL) CMglobal_default_transport = def;
    if (CMglobal_default_transport) {
	if (load_transport(cm, CMglobal_default_transport, 0) == 0) {
	    fprintf(stderr, "Failed to initialize default transport.  Exiting.\n");
	    exit(1);
	}
    }
    while ((transport_names != NULL) && (transport_names[0] != NULL)) {
	load_transport(cm, transport_names[0], 1);
	transport_names++;
    }
    cm->initialized++;
}